

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_newtable(HSQUIRRELVM v)

{
  SQTable *x;
  SQObjectPtr *in_RDI;
  SQSharedState *in_stack_ffffffffffffffd0;
  SQVM *this;
  
  x = SQTable::Create(in_stack_ffffffffffffffd0,(SQInteger)in_RDI);
  this = (SQVM *)&stack0xffffffffffffffe8;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,x);
  SQVM::Push(this,in_RDI);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  return;
}

Assistant:

void sq_newtable(HSQUIRRELVM v)
{
    v->Push(SQTable::Create(_ss(v), 0));
}